

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

int __thiscall
slang::ast::AssertionExpr::bind(AssertionExpr *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  AssertionExprKind AVar1;
  SyntaxNode *this_00;
  SyntaxNode *pSVar2;
  ulong uVar3;
  int iVar4;
  AssertionExpr *pAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  ASTContext *context;
  SourceRange sourceRange;
  ASTContext ctx;
  iterator __begin5;
  ASTContext local_78;
  iterator_base<slang::syntax::PropertyExprSyntax_*> local_40;
  
  context = (ASTContext *)CONCAT44(in_register_00000034,__fd);
  local_78.scope.ptr = (context->scope).ptr;
  local_78.lookupIndex = context->lookupIndex;
  local_78._12_4_ = *(undefined4 *)&context->field_0xc;
  uVar3 = (context->flags).m_bits;
  local_78.instanceOrProc = context->instanceOrProc;
  local_78.firstTempVar = context->firstTempVar;
  local_78.randomizeDetails = context->randomizeDetails;
  local_78.assertionInstance = context->assertionInstance;
  local_78.flags.m_bits = uVar3 | 0x10;
  AVar1 = this->kind;
  if ((((AVar1 - 0xd1 < 0x28) && ((0x8408000001U >> ((ulong)(AVar1 - 0xd1) & 0x3f) & 1) != 0)) ||
      (AVar1 - 0x19f < 2)) || (AVar1 - 0x1fd < 2)) {
LAB_003b7940:
    pAVar5 = BinaryAssertionExpr::fromSyntax((BinaryPropertyExprSyntax *)this,&local_78);
  }
  else if (AVar1 == Unary) {
    pAVar5 = AbortAssertionExpr::fromSyntax((AcceptOnPropertyExprSyntax *)this,&local_78);
  }
  else {
    if (AVar1 == (DisableIff|Simple)) goto LAB_003b7940;
    if (AVar1 == 0x3e) {
      pAVar5 = CaseAssertionExpr::fromSyntax((CasePropertyExprSyntax *)this,&local_78);
    }
    else if (AVar1 == 0x51) {
      pAVar5 = ClockingAssertionExpr::fromSyntax((ClockingPropertyExprSyntax *)this,&local_78);
    }
    else if (AVar1 == 0x5d) {
      pAVar5 = ConditionalAssertionExpr::fromSyntax((ConditionalPropertyExprSyntax *)this,&local_78)
      ;
    }
    else {
      if (AVar1 == 0x151) goto LAB_003b7940;
      if (AVar1 == 0x169) {
        this_00 = *(SyntaxNode **)(this + 3);
        if (this_00 != (SyntaxNode *)0x0) {
          if (((uint)uVar3 >> 0x12 & 1) == 0) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
            ASTContext::addDiag(&local_78,(DiagCode)0x200008,sourceRange);
            pAVar5 = badExpr((local_78.scope.ptr)->compilation,(AssertionExpr *)0x0);
            goto LAB_003b7952;
          }
          local_40.index = 0;
          pSVar2 = this_00[3].previewNode;
          local_40.list = (ParentList *)&this_00[1].previewNode;
          for (; (local_40.list != (ParentList *)&this_00[1].previewNode ||
                 (local_40.index != (ulong)((long)&pSVar2->kind + 1) >> 1));
              local_40.index = local_40.index + 1) {
            pAVar5 = (AssertionExpr *)
                     slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::
                     iterator_base<slang::syntax::PropertyExprSyntax_*>::dereference(&local_40);
            bind(pAVar5,(int)&local_78,(sockaddr *)0x0,0);
          }
        }
        iVar4 = bind((AssertionExpr *)this[2].syntax,__fd,(sockaddr *)0x0,0);
        pAVar5 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar4);
      }
      else if (AVar1 == 0x1f5) {
        pAVar5 = UnaryAssertionExpr::fromSyntax((UnarySelectPropertyExprSyntax *)this,&local_78);
      }
      else if (AVar1 == 0x1be) {
        pAVar5 = StrongWeakAssertionExpr::fromSyntax((StrongWeakPropertyExprSyntax *)this,&local_78)
        ;
      }
      else {
        if (AVar1 != 500) {
          iVar4 = bind((int)this[1].syntax,(sockaddr *)&local_78,(uint)__addr & 0xff);
          pAVar5 = (AssertionExpr *)CONCAT44(extraout_var,iVar4);
          enforceNondegeneracy(pAVar5,context,__len,(SyntaxNode *)this);
          goto LAB_003b7952;
        }
        pAVar5 = UnaryAssertionExpr::fromSyntax((UnaryPropertyExprSyntax *)this,&local_78);
      }
    }
  }
  pAVar5->syntax = (SyntaxNode *)this;
LAB_003b7952:
  return (int)pAVar5;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertyExprSyntax& syntax,
                                         const ASTContext& context, bool allowDisable,
                                         NondegeneracyRequirement nondegRequirement) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    AssertionExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::SimplePropertyExpr: {
            auto& seq = bind(*syntax.as<SimplePropertyExprSyntax>().expr, ctx, allowDisable);
            enforceNondegeneracy(seq, context, nondegRequirement, syntax);
            return seq;
        }
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            result = &BinaryAssertionExpr::fromSyntax(syntax.as<BinaryPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::ParenthesizedPropertyExpr: {
            auto& ppe = syntax.as<ParenthesizedPropertyExprSyntax>();
            if (ppe.matchList) {
                // Similarly to the match list in a parenthesized sequence expression, during
                // argument checking this can be part of an event expression instead.
                if (ctx.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
                    for (auto item : ppe.matchList->items)
                        AssertionExpr::bind(*item, ctx);
                }
                else {
                    ctx.addDiag(diag::InvalidCommaInPropExpr, ppe.matchList->sourceRange());
                    return badExpr(ctx.getCompilation(), nullptr);
                }
            }

            result = const_cast<AssertionExpr*>(&bind(*ppe.expr, context));
            break;
        }
        case SyntaxKind::ClockingPropertyExpr:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<ClockingPropertyExprSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::StrongWeakPropertyExpr:
            result = &StrongWeakAssertionExpr::fromSyntax(syntax.as<StrongWeakPropertyExprSyntax>(),
                                                          ctx);
            break;
        case SyntaxKind::UnaryPropertyExpr:
            result = &UnaryAssertionExpr::fromSyntax(syntax.as<UnaryPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::UnarySelectPropertyExpr:
            result = &UnaryAssertionExpr::fromSyntax(syntax.as<UnarySelectPropertyExprSyntax>(),
                                                     ctx);
            break;
        case SyntaxKind::AcceptOnPropertyExpr:
            result = &AbortAssertionExpr::fromSyntax(syntax.as<AcceptOnPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::ConditionalPropertyExpr:
            result = &ConditionalAssertionExpr::fromSyntax(
                syntax.as<ConditionalPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::CasePropertyExpr:
            result = &CaseAssertionExpr::fromSyntax(syntax.as<CasePropertyExprSyntax>(), ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}